

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O0

int SUNLinSolSolve_Band(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype tol)

{
  sunindextype *p;
  realtype **a;
  realtype *b_00;
  sunindextype *pivots;
  realtype *xdata;
  realtype **A_cols;
  realtype tol_local;
  N_Vector b_local;
  N_Vector x_local;
  SUNMatrix A_local;
  SUNLinearSolver S_local;
  
  if ((((A == (SUNMatrix)0x0) || (S == (SUNLinearSolver)0x0)) || (x == (N_Vector)0x0)) ||
     (b == (N_Vector)0x0)) {
    S_local._4_4_ = -1;
  }
  else {
    N_VScale(0x3ff0000000000000,b,x);
    a = (realtype **)SUNBandMatrix_Cols(A);
    b_00 = (realtype *)N_VGetArrayPointer(x);
    p = *(sunindextype **)((long)S->content + 8);
    if (((a == (realtype **)0x0) || (b_00 == (realtype *)0x0)) || (p == (sunindextype *)0x0)) {
      *(undefined8 *)((long)S->content + 0x10) = 0xfffffffffffffffd;
      S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x10);
    }
    else {
      bandGBTRS(a,*(sunindextype *)((long)A->content + 8),*(sunindextype *)((long)A->content + 0x28)
                ,*(sunindextype *)((long)A->content + 0x20),p,b_00);
      *(undefined8 *)((long)S->content + 0x10) = 0;
      S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x10);
    }
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolSolve_Band(SUNLinearSolver S, SUNMatrix A, N_Vector x, 
                        N_Vector b, realtype tol)
{
  realtype **A_cols, *xdata;
  sunindextype *pivots;
  
  /* check for valid inputs */
  if ( (A == NULL) || (S == NULL) || (x == NULL) || (b == NULL) ) 
    return(SUNLS_MEM_NULL);
  
  /* copy b into x */
  N_VScale(ONE, b, x);

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  xdata = NULL;
  pivots = NULL;
  A_cols = SUNBandMatrix_Cols(A);
  xdata = N_VGetArrayPointer(x);
  pivots = PIVOTS(S);
  if ( (A_cols == NULL) || (xdata == NULL)  || (pivots == NULL) ) {
    LASTFLAG(S) = SUNLS_MEM_FAIL;
    return(LASTFLAG(S));
  }

  /* solve using LU factors */
  bandGBTRS(A_cols, SM_COLUMNS_B(A), SM_SUBAND_B(A), 
            SM_LBAND_B(A), pivots, xdata);
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}